

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventfd-uni.c
# Opt level: O0

void communicate(int descriptor,Arguments *args)

{
  __pid_t _Var1;
  undefined8 in_RSI;
  int descriptor_00;
  int in_EDI;
  pid_t pid;
  Arguments *in_stack_00000018;
  int in_stack_00000024;
  uint in_stack_ffffffffffffffe8;
  
  descriptor_00 = (int)((ulong)in_RSI >> 0x20);
  _Var1 = fork();
  if (_Var1 == -1) {
    throw((char *)0x101377);
  }
  if (_Var1 == 0) {
    client_communicate(descriptor_00,(Arguments *)(ulong)in_stack_ffffffffffffffe8);
    close(in_EDI);
  }
  else {
    server_communicate(in_stack_00000024,in_stack_00000018);
  }
  return;
}

Assistant:

void communicate(int descriptor, struct Arguments* args) {
	// File descriptors can only be shared bewteen related processes,
	// therefore we will need to fork this process
	pid_t pid;

	// Fork a child process
	if ((pid = fork()) == -1) {
		throw("Error forking process");
	}

	// fork() returns 0 for the child process
	if (pid == (pid_t)0) {
		client_communicate(descriptor, args);
		close(descriptor);
	} else {
		server_communicate(descriptor, args);
	}
}